

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_encryptor.h
# Opt level: O2

void __thiscall cppcms::sessions::impl::hmac_factory::~hmac_factory(hmac_factory *this)

{
  (this->super_encryptor_factory)._vptr_encryptor_factory = (_func_int **)&PTR_get_002b7520;
  crypto::key::~key(&this->key_);
  std::__cxx11::string::~string((string *)&this->algo_);
  return;
}

Assistant:

virtual ~hmac_factory() {}